

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

FT_Error cff_blend_build_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  CFF_VarRegion *pCVar1;
  CFF_AxisCoords *pCVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  FT_Int32 *pFVar7;
  FT_Long FVar8;
  long lVar9;
  FT_Fixed *__dest;
  long b_;
  CFF_Font pCVar10;
  CFF_VarData *pCVar11;
  long *plVar12;
  ulong uVar13;
  long a_;
  FT_Memory memory;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  FT_Error error;
  FT_Error local_74;
  long local_70;
  CFF_VarData *local_68;
  FT_UInt local_60;
  FT_UInt local_5c;
  ulong local_58;
  long *local_50;
  CFF_Font local_48;
  ulong local_40;
  FT_Memory local_38;
  
  local_74 = 0;
  if (NDV != (FT_Fixed *)0x0 || lenNDV == 0) {
    local_48 = blend->font;
    memory = local_48->memory;
    blend->builtBV = '\0';
    if (((lenNDV == 0) || ((local_48->vstore).axisCount == lenNDV)) &&
       (vsindex < (local_48->vstore).dataCount)) {
      local_68 = (local_48->vstore).varData;
      uVar16 = local_68[vsindex].regionIdxCount + 1;
      local_50 = NDV;
      pFVar7 = (FT_Int32 *)
               ft_mem_qrealloc(memory,4,(ulong)blend->lenBV,(ulong)uVar16,blend->BV,&local_74);
      blend->BV = pFVar7;
      if (local_74 != 0) {
        return local_74;
      }
      blend->lenBV = uVar16;
      local_58 = (ulong)lenNDV;
      local_60 = vsindex;
      if (uVar16 != 0) {
        pCVar11 = local_68 + vsindex;
        uVar13 = (ulong)uVar16;
        lVar14 = local_58 * 0x18;
        uVar15 = 0;
        pCVar10 = local_48;
        local_70 = lVar14;
        local_68 = pCVar11;
        local_5c = lenNDV;
        local_40 = uVar13;
        local_38 = memory;
        do {
          if (uVar15 == 0) {
            *blend->BV = 0x10000;
LAB_00225e9f:
            iVar6 = 0xb;
          }
          else {
            uVar16 = pCVar11->regionIndices[uVar15 - 1];
            if (uVar16 < (pCVar10->vstore).regionCount) {
              if (lenNDV == 0) {
                blend->BV[uVar15] = 0;
                goto LAB_00225e9f;
              }
              pCVar1 = (pCVar10->vstore).varRegionList;
              blend->BV[uVar15] = 0x10000;
              lVar17 = 0;
              plVar12 = local_50;
              do {
                pCVar2 = pCVar1[uVar16].axisList;
                lVar9 = *(long *)((long)&pCVar2->startCoord + lVar17);
                lVar3 = *(long *)((long)&pCVar2->peakCoord + lVar17);
                iVar6 = 0x10000;
                if (lVar9 <= lVar3) {
                  lVar4 = *(long *)((long)&pCVar2->endCoord + lVar17);
                  b_ = lVar4 - lVar3;
                  if (lVar3 <= lVar4) {
                    if ((lVar3 != 0) && (-1 < lVar9 || lVar4 < 1)) {
                      lVar5 = *plVar12;
                      a_ = lVar4 - lVar5;
                      lVar14 = local_70;
                      if (lVar4 < lVar5 || lVar5 < lVar9) {
                        iVar6 = 0;
                      }
                      else if (lVar5 != lVar3) {
                        if (lVar5 < lVar3) {
                          b_ = lVar3 - lVar9;
                          a_ = lVar5 - lVar9;
                        }
                        FVar8 = FT_DivFix(a_,b_);
                        iVar6 = (int)FVar8;
                        lVar14 = local_70;
                      }
                    }
                  }
                }
                lVar9 = (long)iVar6 * (long)blend->BV[uVar15];
                blend->BV[uVar15] = (FT_Int32)((ulong)(lVar9 + (lVar9 >> 0x3f) + 0x8000) >> 0x10);
                lVar17 = lVar17 + 0x18;
                plVar12 = plVar12 + 1;
              } while (lVar14 != lVar17);
              iVar6 = 0;
              pCVar10 = local_48;
              pCVar11 = local_68;
              uVar13 = local_40;
              memory = local_38;
              lenNDV = local_5c;
            }
            else {
              local_74 = 3;
              iVar6 = 4;
            }
          }
          if ((iVar6 != 0) && (iVar6 != 0xb)) {
            if (iVar6 == 4) {
              return local_74;
            }
            return iVar6;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar13);
      }
      uVar13 = local_58;
      blend->lastVsindex = local_60;
      if (lenNDV != 0) {
        __dest = (FT_Fixed *)
                 ft_mem_qrealloc(memory,8,(ulong)blend->lenNDV,local_58,blend->lastNDV,&local_74);
        blend->lastNDV = __dest;
        if (local_74 != 0) {
          return local_74;
        }
        memcpy(__dest,local_50,uVar13 << 3);
      }
      blend->lenNDV = lenNDV;
      blend->builtBV = '\x01';
      return local_74;
    }
  }
  return 3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_blend_build_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    FT_Error   error  = FT_Err_Ok;            /* for FT_REALLOC */
    FT_Memory  memory = blend->font->memory;  /* for FT_REALLOC */

    FT_UInt       len;
    CFF_VStore    vs;
    CFF_VarData*  varData;
    FT_UInt       master;


    /* protect against malformed fonts */
    if ( !( lenNDV == 0 || NDV ) )
    {
      FT_TRACE4(( " cff_blend_build_vector:"
                  " Malformed Normalize Design Vector data\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    blend->builtBV = FALSE;

    vs = &blend->font->vstore;

    /* VStore and fvar must be consistent */
    if ( lenNDV != 0 && lenNDV != vs->axisCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: Axis count mismatch\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( vsindex >= vs->dataCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: vsindex out of range\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* select the item variation data structure */
    varData = &vs->varData[vsindex];

    /* prepare buffer for the blend vector */
    len = varData->regionIdxCount + 1;    /* add 1 for default component */
    if ( FT_QRENEW_ARRAY( blend->BV, blend->lenBV, len ) )
      goto Exit;

    blend->lenBV = len;

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < len; master++ )
    {
      FT_UInt         j;
      FT_UInt         idx;
      CFF_VarRegion*  varRegion;


      /* default factor is always one */
      if ( master == 0 )
      {
        blend->BV[master] = FT_FIXED_ONE;
        FT_TRACE4(( "   build blend vector len %d\n", len ));
        FT_TRACE4(( "   [ %f ", blend->BV[master] / 65536.0 ));
        continue;
      }

      /* VStore array does not include default master, so subtract one */
      idx       = varData->regionIndices[master - 1];
      varRegion = &vs->varRegionList[idx];

      if ( idx >= vs->regionCount )
      {
        FT_TRACE4(( " cff_blend_build_vector:"
                    " region index out of range\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* Note: `lenNDV' could be zero.                              */
      /*       In that case, build default blend vector (1,0,0...). */
      if ( !lenNDV )
      {
        blend->BV[master] = 0;
        continue;
      }

      /* In the normal case, initialize each component to 1 */
      /* before inner loop.                                 */
      blend->BV[master] = FT_FIXED_ONE; /* default */

      /* inner loop steps through axes in this region */
      for ( j = 0; j < lenNDV; j++ )
      {
        CFF_AxisCoords*  axis = &varRegion->axisList[j];
        FT_Fixed         axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( NDV[j] < axis->startCoord ||
                  NDV[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( NDV[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( NDV[j] < axis->peakCoord )
            axisScalar = FT_DivFix( NDV[j] - axis->startCoord,
                                    axis->peakCoord - axis->startCoord );
          else
            axisScalar = FT_DivFix( axis->endCoord - NDV[j],
                                    axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        blend->BV[master] = FT_MulFix( blend->BV[master], axisScalar );
      }

      FT_TRACE4(( ", %f ",
                  blend->BV[master] / 65536.0 ));
    }

    FT_TRACE4(( "]\n" ));

    /* record the parameters used to build the blend vector */
    blend->lastVsindex = vsindex;

    if ( lenNDV != 0 )
    {
      /* user has set a normalized vector */
      if ( FT_QRENEW_ARRAY( blend->lastNDV, blend->lenNDV, lenNDV ) )
        goto Exit;

      FT_MEM_COPY( blend->lastNDV,
                   NDV,
                   lenNDV * sizeof ( *NDV ) );
    }

    blend->lenNDV  = lenNDV;
    blend->builtBV = TRUE;

  Exit:
    return error;
  }